

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HelperFunctions.cpp
# Opt level: O2

void middleOut(bool precompression,ifstream *sourceFile,ofstream *compressedFile)

{
  __type _Var1;
  int iVar2;
  ostream *poVar3;
  Word *pWVar4;
  char *pcVar5;
  string *this;
  int i;
  ulong uVar6;
  long lVar7;
  bool bVar8;
  int i_1;
  string currentWord;
  string local_258;
  Word newWord;
  
  lVar7 = *(long *)(*(long *)sourceFile + -0x18);
  if (((byte)sourceFile[lVar7 + 0x20] & 5) != 0) {
    poVar3 = std::operator<<((ostream *)&std::cerr,"File not found... maybe use pipey");
    std::endl<char,std::char_traits<char>>(poVar3);
LAB_00103592:
    exit(0);
  }
  currentWord._M_dataplus._M_p = (pointer)&currentWord.field_2;
  if (precompression) {
    currentWord._M_string_length = 0;
    currentWord.field_2._M_local_buf[0] = '\0';
    while (((byte)sourceFile[lVar7 + 0x20] & 2) == 0) {
      std::operator>>((istream *)sourceFile,(string *)&currentWord);
      poVar3 = std::operator<<((ostream *)&std::cout,(string *)&currentWord);
      std::endl<char,std::char_traits<char>>(poVar3);
      lVar7 = 0;
      uVar6 = 0;
      bVar8 = false;
      while( true ) {
        if ((ulong)(((long)wordList.super__Vector_base<Word,_std::allocator<Word>_>._M_impl.
                           super__Vector_impl_data._M_finish -
                    (long)wordList.super__Vector_base<Word,_std::allocator<Word>_>._M_impl.
                          super__Vector_impl_data._M_start) / 0x28) <= uVar6) break;
        Word::getWord_abi_cxx11_
                  (&newWord._word,
                   (Word *)((long)&((wordList.super__Vector_base<Word,_std::allocator<Word>_>.
                                     _M_impl.super__Vector_impl_data._M_start)->_word)._M_dataplus.
                                   _M_p + lVar7));
        _Var1 = std::operator==(&currentWord,&newWord._word);
        std::__cxx11::string::~string((string *)&newWord);
        if (_Var1) {
          pWVar4 = (Word *)((long)&((wordList.super__Vector_base<Word,_std::allocator<Word>_>.
                                     _M_impl.super__Vector_impl_data._M_start)->_word)._M_dataplus.
                                   _M_p + lVar7);
          iVar2 = Word::getFrequency(pWVar4);
          bVar8 = true;
          Word::setFrequency(pWVar4,iVar2 + 1);
        }
        uVar6 = uVar6 + 1;
        lVar7 = lVar7 + 0x28;
      }
      if (!bVar8) {
        poVar3 = std::operator<<((ostream *)&std::cout,"Adding word");
        std::endl<char,std::char_traits<char>>(poVar3);
        std::__cxx11::string::string((string *)&local_258,(string *)&currentWord);
        Word::Word(&newWord,&local_258,1);
        std::__cxx11::string::~string((string *)&local_258);
        std::vector<Word,_std::allocator<Word>_>::push_back(&wordList,&newWord);
        poVar3 = std::ostream::_M_insert<unsigned_long>((ulong)&std::cout);
        std::endl<char,std::char_traits<char>>(poVar3);
        std::__cxx11::string::~string((string *)&newWord);
      }
      lVar7 = *(long *)(*(long *)sourceFile + -0x18);
    }
    lVar7 = 0;
    uVar6 = 0;
    while( true ) {
      if (((long)wordList.super__Vector_base<Word,_std::allocator<Word>_>._M_impl.
                 super__Vector_impl_data._M_finish -
          (long)wordList.super__Vector_base<Word,_std::allocator<Word>_>._M_impl.
                super__Vector_impl_data._M_start) / 0x28 - 1U <= uVar6) break;
      iVar2 = Word::getFrequency((Word *)((long)&((wordList.
                                                  super__Vector_base<Word,_std::allocator<Word>_>.
                                                  _M_impl.super__Vector_impl_data._M_start)->_word).
                                                 _M_dataplus._M_p + lVar7));
      pWVar4 = (Word *)((long)&((wordList.super__Vector_base<Word,_std::allocator<Word>_>._M_impl.
                                 super__Vector_impl_data._M_start)->_word)._M_dataplus._M_p + lVar7)
      ;
      if (maxCount < iVar2) {
        maxCount = Word::getFrequency(pWVar4);
        Word::getWord_abi_cxx11_
                  (&newWord._word,
                   (Word *)((long)&((wordList.super__Vector_base<Word,_std::allocator<Word>_>.
                                     _M_impl.super__Vector_impl_data._M_start)->_word)._M_dataplus.
                                   _M_p + lVar7));
        this = &maxWord_abi_cxx11_;
LAB_0010355b:
        std::__cxx11::string::operator=((string *)this,(string *)&newWord);
        std::__cxx11::string::~string((string *)&newWord);
      }
      else {
        iVar2 = Word::getFrequency(pWVar4);
        pWVar4 = (Word *)((long)&((wordList.super__Vector_base<Word,_std::allocator<Word>_>._M_impl.
                                   super__Vector_impl_data._M_start)->_word)._M_dataplus._M_p +
                         lVar7);
        if (secondMaxCount < iVar2) {
          secondMaxCount = Word::getFrequency(pWVar4);
          Word::getWord_abi_cxx11_
                    (&newWord._word,
                     (Word *)((long)&((wordList.super__Vector_base<Word,_std::allocator<Word>_>.
                                       _M_impl.super__Vector_impl_data._M_start)->_word)._M_dataplus
                                     ._M_p + lVar7));
          this = &secondMaxWord_abi_cxx11_;
          goto LAB_0010355b;
        }
        iVar2 = Word::getFrequency(pWVar4);
        if (thirdMaxCount < iVar2) {
          thirdMaxCount =
               Word::getFrequency((Word *)((long)&((wordList.
                                                  super__Vector_base<Word,_std::allocator<Word>_>.
                                                  _M_impl.super__Vector_impl_data._M_start)->_word).
                                                  _M_dataplus._M_p + lVar7));
          Word::getWord_abi_cxx11_
                    (&newWord._word,
                     (Word *)((long)&((wordList.super__Vector_base<Word,_std::allocator<Word>_>.
                                       _M_impl.super__Vector_impl_data._M_start)->_word)._M_dataplus
                                     ._M_p + lVar7));
          this = &thirdMaxWord_abi_cxx11_;
          goto LAB_0010355b;
        }
      }
      uVar6 = uVar6 + 1;
      lVar7 = lVar7 + 0x28;
    }
  }
  else {
    currentWord._M_string_length = 0;
    currentWord.field_2._M_local_buf[0] = '\0';
    std::ifstream::ifstream(&newWord,"test.txt",_S_in);
    lVar7 = *(long *)(newWord._word._M_dataplus._M_p + -0x18);
    if ((*(byte *)((long)&newWord._frequency + lVar7) & 5) != 0) {
      poVar3 = std::operator<<((ostream *)&std::cerr,"File not found... maybe use pipey");
      std::endl<char,std::char_traits<char>>(poVar3);
      goto LAB_00103592;
    }
    while ((*(byte *)((long)&newWord._frequency + lVar7) & 2) == 0) {
      std::operator>>((istream *)&newWord,(string *)&currentWord);
      iVar2 = std::istream::peek();
      if (iVar2 == 10) {
        std::operator<<((ostream *)compressedFile,"\n");
      }
      _Var1 = std::operator==(&currentWord,&maxWord_abi_cxx11_);
      pcVar5 = " 1";
      if (_Var1) {
LAB_0010342e:
        std::operator<<((ostream *)compressedFile,pcVar5);
      }
      else {
        _Var1 = std::operator==(&currentWord,&secondMaxWord_abi_cxx11_);
        pcVar5 = " 2";
        if (_Var1) goto LAB_0010342e;
        _Var1 = std::operator==(&currentWord,&thirdMaxWord_abi_cxx11_);
        pcVar5 = " 3";
        if (_Var1) goto LAB_0010342e;
        poVar3 = std::operator<<((ostream *)compressedFile," ");
        std::operator<<(poVar3,(string *)&currentWord);
      }
      lVar7 = *(long *)(newWord._word._M_dataplus._M_p + -0x18);
    }
    std::ifstream::~ifstream(&newWord);
  }
  std::__cxx11::string::~string((string *)&currentWord);
  return;
}

Assistant:

void middleOut(bool precompression,  ifstream &sourceFile, ofstream &compressedFile)
{

    // Ensure the source file is opened properly again
    if(sourceFile.fail())
    {
        cerr << "File not found... maybe use pipey"<< endl;
        exit(0);

    }

    // If just parsing logic is different than compressing
    if (precompression)
    {
        // Read each word in one at a time until at end of file
        string currentWord;

        while (!sourceFile.eof())
        {
            // Boolean for tracking if a word is in list already or not
            bool wordMatch = false;
            // Read current word
            sourceFile >> currentWord;
            // Debugging
            cout << currentWord << endl;

            // Loop through every word in the list of seen words and check if current word is a match
            for (int i = 0; i < wordList.size(); i++)
            {
                // If it matches word in list already set match flag to true and add plus one to frequency count of that
                // specific word frequency

                if (currentWord == wordList[i].getWord())
                {
                    wordMatch = true;
                    wordList[i].setFrequency((wordList[i].getFrequency()) + 1);
                }
            }

            // If matching flag was never set indicating non of the words in the vector are the current word than
            // save a new Word object using the current word as paramater for construction
            if (!wordMatch)
            {
                cout << "Adding word" << endl;
                // New word object with current word name and 1 as starting frequency
                Word newWord(currentWord, 1);

                // Add to back of word vector
                wordList.push_back(newWord);
                //Debugging
                cout << wordList.size() << endl;

            }

        }

        // For all words in the saved wordlist get top three most frequent ones and save to global variables
        for (int i = 0; i < wordList.size()-1; i++)
        {
            // Max word biggest bang for your buck
            if (wordList[i].getFrequency() > maxCount)
            {
                maxCount = wordList[i].getFrequency();
                maxWord = wordList[i].getWord();
            }

            // Second most common
            else if (wordList[i].getFrequency()> secondMaxCount)
            {
                // Store seccond most common
                secondMaxCount = wordList[i].getFrequency();
                secondMaxWord = wordList[i].getWord();

            }
            // Third most common
            else if (wordList[i].getFrequency() > thirdMaxCount)
            {
                thirdMaxCount  = wordList[i].getFrequency();
                thirdMaxWord = wordList[i].getWord();

            }
        }
    }

    // If not precompressing actually compress
    else
    {
        // Compress the file actually

        string currentWord;

        // Reload file and ensure it opens properly
        ifstream loadFile("test.txt");
        if (loadFile.fail())
        {
            cerr << "File not found... maybe use pipey"<< endl;
            exit(0);
        }

        // Read every word in source one at a time and replace if matches top 3
        while (!loadFile.eof())
        {

            loadFile >> currentWord;
            // Check current char to determin when to save a new line in compressed.pra
            if (loadFile.peek() == '\n')
            {
                compressedFile << "\n";
            }

            // Check for top 3 matching words if found replace with mapping byte
            if (currentWord == maxWord)
            {
                compressedFile << " 1";

            }
            else if (currentWord == secondMaxWord)
            {
                compressedFile << " 2";
            }
            else if (currentWord == thirdMaxWord)
            {
                compressedFile << " 3";
            }

            // If the word doesnt match the top 3 simple save it as is to the compressed.pra file
            else
            {
                compressedFile << " " << currentWord;
            }
        }
    }


}